

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_InsertRange_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_InsertRange_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  int iVar1;
  iterator it;
  const_iterator f;
  const_iterator l;
  bool bVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  value_type vVar7;
  value_type vVar8;
  value_type vVar9;
  value_type vVar10;
  value_type vVar11;
  value_type vVar12;
  value_type vVar13;
  value_type vVar14;
  value_type vVar15;
  value_type vVar16;
  value_type vVar17;
  reference piVar18;
  _Rb_tree_const_iterator<int> _Var19;
  _Rb_tree_const_iterator<int> _Var20;
  _Rb_tree_const_iterator<int> _Var21;
  _Rb_tree_const_iterator<int> _Var22;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar23;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  const_iterator set_end;
  const_iterator set_begin;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  const_iterator end;
  const_iterator begin;
  set<int,_std::less<int>,_std::allocator<int>_> set_input;
  value_type input [4];
  TypeParam ht_source;
  undefined8 in_stack_fffffffffffff538;
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff540;
  HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  allocator_type *in_stack_fffffffffffff550;
  undefined4 in_stack_fffffffffffff558;
  undefined4 uVar24;
  undefined4 in_stack_fffffffffffff55c;
  int iVar25;
  hasher *in_stack_fffffffffffff560;
  _Rb_tree_const_iterator<int> *__i;
  undefined4 in_stack_fffffffffffff568;
  undefined4 in_stack_fffffffffffff56c;
  Type type;
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff570;
  AssertHelper *this_02;
  undefined8 in_stack_fffffffffffff588;
  nonempty_iterator in_stack_fffffffffffff590;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff598;
  _Base_ptr expected_predicate_value;
  char *actual_predicate_value;
  _Rb_tree_const_iterator<int> *expression_text;
  AssertionResult *assertion_result;
  AssertHelper *this_03;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff5e0;
  bool local_9b1;
  value_type *in_stack_fffffffffffff678;
  undefined4 in_stack_fffffffffffff680;
  undefined4 in_stack_fffffffffffff684;
  undefined4 uVar26;
  undefined4 in_stack_fffffffffffff694;
  undefined4 uVar27;
  undefined4 in_stack_fffffffffffff6a4;
  undefined4 uVar28;
  undefined4 in_stack_fffffffffffff6b4;
  undefined4 uVar29;
  undefined4 in_stack_fffffffffffff6c4;
  undefined4 uVar30;
  undefined4 in_stack_fffffffffffff6d0;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pBVar31;
  undefined4 in_stack_fffffffffffff6e0;
  value_type *pvVar32;
  undefined4 in_stack_fffffffffffff6f0;
  value_type *pvVar33;
  undefined4 in_stack_fffffffffffff700;
  AssertionResult local_888 [2];
  size_type local_868;
  undefined4 local_85c;
  AssertionResult local_858;
  _Base_ptr local_848;
  _Base_ptr local_840;
  _Base_ptr local_838;
  _Rb_tree_const_iterator<int> local_830;
  _Rb_tree_const_iterator<int> local_828;
  string local_820 [535];
  bool local_609;
  AssertionResult local_608 [2];
  size_type local_5e8;
  undefined4 local_5dc;
  AssertionResult local_5d8;
  set<int,_std::less<int>,_std::allocator<int>_> *local_5c8;
  HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pHStack_5c0;
  _Base_ptr local_5b8;
  _Base_ptr p_Stack_5b0;
  char *local_5a8;
  _Rb_tree_const_iterator<int> *p_Stack_5a0;
  AssertionResult *local_598;
  AssertHelper *pAStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  set<int,_std::less<int>,_std::allocator<int>_> *local_578;
  HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pHStack_570;
  _Base_ptr local_568;
  _Base_ptr p_Stack_560;
  char *local_558;
  _Rb_tree_const_iterator<int> *p_Stack_550;
  AssertionResult *local_548;
  AssertHelper *pAStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  set<int,_std::less<int>,_std::allocator<int>_> *local_528;
  HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pHStack_520;
  _Base_ptr local_518;
  _Base_ptr p_Stack_510;
  char *local_508;
  _Rb_tree_const_iterator<int> *p_Stack_500;
  AssertionResult *local_4f8;
  AssertHelper *pAStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  const_iterator *pcStack_4d0;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  const_iterator *pcStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  set<int,_std::less<int>,_std::allocator<int>_> *local_488;
  HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pHStack_480;
  _Base_ptr local_478;
  _Base_ptr p_Stack_470;
  char *local_468;
  _Rb_tree_const_iterator<int> *p_Stack_460;
  AssertionResult *local_458;
  AssertHelper *pAStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  _Base_ptr local_438;
  undefined1 local_430;
  value_type local_424;
  _Base_ptr local_420;
  undefined1 local_418;
  value_type local_40c;
  _Base_ptr local_408;
  undefined1 local_400;
  value_type local_3f4;
  _Base_ptr local_3f0;
  undefined1 local_3e8;
  value_type local_3dc;
  _Base_ptr local_3d8;
  undefined1 local_3d0;
  value_type local_3c4;
  _Base_ptr local_3c0;
  undefined1 local_3b8;
  value_type local_3ac;
  int local_328;
  value_type local_324;
  value_type local_320;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_31c;
  value_type local_25c;
  value_type local_1fc;
  value_type local_19c;
  value_type local_13c;
  value_type local_e0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_d0;
  Hasher local_c0;
  Hasher local_b4 [15];
  
  iVar25 = (int)((ulong)in_stack_fffffffffffff538 >> 0x20);
  Hasher::Hasher(local_b4,0);
  Hasher::Hasher(&local_c0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_d0,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_fffffffffffff570,CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568)
             ,in_stack_fffffffffffff560,
             (key_equal *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),
             in_stack_fffffffffffff550);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_d0);
  vVar3 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffff540,iVar25);
  local_e0 = vVar3;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
           in_stack_fffffffffffff678);
  vVar4 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffff540,iVar25);
  local_13c = vVar4;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
           in_stack_fffffffffffff678);
  vVar5 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffff540,iVar25);
  local_19c = vVar5;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
           in_stack_fffffffffffff678);
  vVar6 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffff540,iVar25);
  local_1fc = vVar6;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
           in_stack_fffffffffffff678);
  vVar7 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffff540,iVar25);
  local_25c = vVar7;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
           in_stack_fffffffffffff678);
  vVar8 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffff540,iVar25);
  local_31c.ht_.table.groups.
  super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = vVar8;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff684,in_stack_fffffffffffff680),
           in_stack_fffffffffffff678);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffff5e0);
  piVar18 = google::
            sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            ::operator*((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                         *)0xe4072f);
  local_328 = *piVar18;
  pvVar33 = &local_324;
  vVar9 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffff540,iVar25);
  *pvVar33 = vVar9;
  pvVar32 = &local_320;
  vVar10 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff540,iVar25);
  *pvVar32 = vVar10;
  pBVar31 = &local_31c;
  vVar11 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff540,iVar25);
  *(value_type *)&pBVar31->_vptr_BaseHashtableInterface = vVar11;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0xe4080b);
  vVar12 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff540,iVar25);
  local_3ac = vVar12;
  pVar23 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff560,
                      (value_type_conflict *)
                      CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  _Var19 = pVar23.first._M_node;
  local_3b8 = pVar23.second;
  uVar30 = CONCAT13(local_3b8,(int3)in_stack_fffffffffffff6c4);
  local_3c0 = _Var19._M_node;
  vVar13 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff540,iVar25);
  local_3c4 = vVar13;
  pVar23 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff560,
                      (value_type_conflict *)
                      CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  _Var20 = pVar23.first._M_node;
  local_3d0 = pVar23.second;
  uVar29 = CONCAT13(local_3d0,(int3)in_stack_fffffffffffff6b4);
  local_3d8 = _Var20._M_node;
  vVar14 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff540,iVar25);
  local_3dc = vVar14;
  pVar23 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff560,
                      (value_type_conflict *)
                      CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  _Var21 = pVar23.first._M_node;
  local_3e8 = pVar23.second;
  uVar28 = CONCAT13(local_3e8,(int3)in_stack_fffffffffffff6a4);
  local_3f0 = _Var21._M_node;
  vVar15 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff540,iVar25);
  local_3f4 = vVar15;
  pVar23 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff560,
                      (value_type_conflict *)
                      CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  _Var22 = pVar23.first._M_node;
  local_400 = pVar23.second;
  uVar27 = CONCAT13(local_400,(int3)in_stack_fffffffffffff694);
  local_408 = _Var22._M_node;
  vVar16 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff540,iVar25);
  local_40c = vVar16;
  pVar23 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff560,
                      (value_type_conflict *)
                      CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  local_420 = (_Base_ptr)pVar23.first._M_node;
  local_418 = pVar23.second;
  uVar26 = CONCAT13(local_418,(int3)in_stack_fffffffffffff684);
  vVar17 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff540,iVar25);
  local_424 = vVar17;
  pVar23 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff560,
                      (value_type_conflict *)
                      CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  local_438 = (_Base_ptr)pVar23.first._M_node;
  local_430 = pVar23.second;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffff5e0);
  iVar25 = (int)((ulong)local_4b8 >> 0x20);
  it.super_iterator.pos.row_begin._M_current._0_4_ = (int)local_4b8;
  it.super_iterator.ht =
       (sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_4c0;
  it.super_iterator.pos.row_begin._M_current._4_4_ = iVar25;
  it.super_iterator.pos.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       pcStack_4b0;
  it.super_iterator.pos.row_current._M_current._0_4_ = (int)local_4a8;
  it.super_iterator.pos.row_current._M_current._4_4_ = (int)((ulong)local_4a8 >> 0x20);
  it.super_iterator.pos.col_current = (nonempty_iterator)uStack_4a0;
  it.super_iterator.end.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       local_498;
  it.super_iterator.end.row_end._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       uStack_490;
  it.super_iterator.end.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       in_stack_fffffffffffff588;
  it.super_iterator.end.col_current = in_stack_fffffffffffff590;
  it.parent_ = in_stack_fffffffffffff598;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::const_iterator(pcStack_4d0,it);
  local_4e8 = local_448;
  uStack_4e0 = uStack_440;
  local_4f8 = local_458;
  pAStack_4f0 = pAStack_450;
  local_508 = local_468;
  p_Stack_500 = p_Stack_460;
  local_518 = local_478;
  p_Stack_510 = p_Stack_470;
  local_528 = local_488;
  pHStack_520 = pHStack_480;
  std::
  advance<google::BaseHashtableInterface<google::sparse_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>::const_iterator,int>
            (pcStack_4b0,iVar25);
  local_538 = local_448;
  uStack_530 = uStack_440;
  local_548 = local_458;
  pAStack_540 = pAStack_450;
  local_558 = local_468;
  p_Stack_550 = p_Stack_460;
  local_568 = local_478;
  p_Stack_560 = p_Stack_470;
  local_578 = local_488;
  pHStack_570 = pHStack_480;
  local_588 = local_4e8;
  uStack_580 = uStack_4e0;
  local_598 = local_4f8;
  pAStack_590 = pAStack_4f0;
  local_5a8 = local_508;
  p_Stack_5a0 = p_Stack_500;
  local_5b8 = local_518;
  p_Stack_5b0 = p_Stack_510;
  local_5c8 = local_528;
  pHStack_5c0 = pHStack_520;
  type = (Type)((ulong)local_458 >> 0x20);
  uVar24 = SUB84(local_468,0);
  iVar25 = (int)((ulong)local_468 >> 0x20);
  f.super_const_iterator.ht._4_4_ = uVar27;
  f.super_const_iterator.ht._0_4_ = vVar16;
  f.super_const_iterator.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       _Var22._M_node;
  f.super_const_iterator.pos.row_end._M_current._0_4_ = vVar15;
  f.super_const_iterator.pos.row_end._M_current._4_4_ = uVar28;
  f.super_const_iterator.pos.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       _Var21._M_node;
  f.super_const_iterator.pos.col_current._0_4_ = vVar14;
  f.super_const_iterator.pos.col_current._4_4_ = uVar29;
  f.super_const_iterator.end.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       _Var20._M_node;
  f.super_const_iterator.end.row_end._M_current._0_4_ = vVar13;
  f.super_const_iterator.end.row_end._M_current._4_4_ = uVar30;
  f.super_const_iterator.end.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       _Var19._M_node;
  f.super_const_iterator.end.col_current._0_4_ = in_stack_fffffffffffff6d0;
  f.super_const_iterator.end.col_current._4_4_ = vVar12;
  f.parent_ = pBVar31;
  l.super_const_iterator.ht._4_4_ = vVar11;
  l.super_const_iterator.ht._0_4_ = in_stack_fffffffffffff6e0;
  l.super_const_iterator.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       pvVar32;
  l.super_const_iterator.pos.row_end._M_current._0_4_ = in_stack_fffffffffffff6f0;
  l.super_const_iterator.pos.row_end._M_current._4_4_ = vVar10;
  l.super_const_iterator.pos.row_current._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       pvVar33;
  l.super_const_iterator.pos.col_current._0_4_ = in_stack_fffffffffffff700;
  l.super_const_iterator.pos.col_current._4_4_ = vVar9;
  l.super_const_iterator.end.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       piVar18;
  l.super_const_iterator.end.row_end._M_current._0_4_ = vVar8;
  l.super_const_iterator.end.row_end._M_current._4_4_ = vVar7;
  l.super_const_iterator.end.row_current._M_current._0_4_ = vVar6;
  l.super_const_iterator.end.row_current._M_current._4_4_ = vVar5;
  l.super_const_iterator.end.col_current._0_4_ = vVar4;
  l.super_const_iterator.end.col_current._4_4_ = vVar3;
  l.parent_ = in_RDI;
  expected_predicate_value = p_Stack_510;
  actual_predicate_value = local_508;
  expression_text = p_Stack_500;
  assertion_result = local_4f8;
  this_03 = pAStack_4f0;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
  ::
  insert<google::BaseHashtableInterface<google::sparse_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>::const_iterator>
            ((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)CONCAT44(uVar26,vVar17),f,l);
  local_5dc = 3;
  local_5e8 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe40cb8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar25,uVar24),(char *)p_Stack_470,&local_478->_M_color,
             (unsigned_long *)pHStack_480);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_5d8);
  this_00 = local_488;
  this_01 = pHStack_480;
  _Var19._M_node = local_478;
  _Var20._M_node = p_Stack_470;
  __i = p_Stack_460;
  this_02 = pAStack_450;
  if (!bVar2) {
    testing::Message::Message((Message *)pAStack_450);
    testing::AssertionResult::failure_message((AssertionResult *)0xe40d79);
    testing::internal::AssertHelper::AssertHelper
              (pAStack_450,type,(char *)p_Stack_460,iVar25,(char *)p_Stack_470);
    testing::internal::AssertHelper::operator=(this_03,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pHStack_480);
    testing::Message::~Message((Message *)0xe40ddc);
    this_00 = local_488;
    this_01 = pHStack_480;
    _Var19._M_node = local_478;
    _Var20._M_node = p_Stack_470;
    __i = p_Stack_460;
    this_02 = pAStack_450;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe40e4d);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffff5e0);
  piVar18 = google::
            sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            ::operator*((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                         *)0xe40e75);
  iVar1 = *piVar18;
  vVar3 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(this_01,(int)((ulong)this_00 >> 0x20));
  local_9b1 = true;
  if (iVar1 != vVar3) {
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::begin(in_stack_fffffffffffff5e0);
    piVar18 = google::
              sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator*((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                           *)0xe40ef2);
    iVar1 = *piVar18;
    vVar3 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(this_01,(int)((ulong)this_00 >> 0x20));
    local_9b1 = true;
    if (iVar1 != vVar3) {
      google::
      BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::begin(in_stack_fffffffffffff5e0);
      piVar18 = google::
                sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::operator*((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)0xe40f6f);
      iVar1 = *piVar18;
      vVar3 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(this_01,(int)((ulong)this_00 >> 0x20));
      local_9b1 = true;
      if (iVar1 != vVar3) {
        google::
        BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        ::begin(in_stack_fffffffffffff5e0);
        piVar18 = google::
                  sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  ::operator*((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                               *)0xe40fec);
        iVar1 = *piVar18;
        vVar3 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(this_01,(int)((ulong)this_00 >> 0x20));
        local_9b1 = true;
        if (iVar1 != vVar3) {
          google::
          BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::begin(in_stack_fffffffffffff5e0);
          piVar18 = google::
                    sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    ::operator*((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                 *)0xe41069);
          iVar1 = *piVar18;
          vVar3 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::UniqueObject(this_01,(int)((ulong)this_00 >> 0x20));
          local_9b1 = true;
          if (iVar1 != vVar3) {
            google::
            BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::begin(in_stack_fffffffffffff5e0);
            piVar18 = google::
                      sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      ::operator*((sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                   *)0xe410e2);
            iVar1 = *piVar18;
            vVar3 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ::UniqueObject(this_01,(int)((ulong)this_00 >> 0x20));
            local_9b1 = iVar1 == vVar3;
          }
        }
      }
    }
  }
  local_609 = local_9b1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_01,(bool *)this_00,(type *)0xe4115b);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_608);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)expression_text,actual_predicate_value,
               (char *)expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,(char *)__i,iVar25,(char *)_Var20._M_node);
    testing::internal::AssertHelper::operator=(this_03,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    std::__cxx11::string::~string(local_820);
    testing::Message::~Message((Message *)0xe41230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe412c7);
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_828);
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_830);
  local_838 = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(this_00);
  local_830._M_node = local_838;
  local_828._M_node = local_838;
  std::advance<std::_Rb_tree_const_iterator<int>,int>(__i,iVar25);
  local_840 = local_828._M_node;
  local_848 = local_830._M_node;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
  ::insert<std::_Rb_tree_const_iterator<int>>
            ((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)this_01,_Var20,_Var19);
  local_85c = 6;
  local_868 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe41391);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar25,uVar24),(char *)_Var20._M_node,&(_Var19._M_node)->_M_color,
             (unsigned_long *)this_01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_858);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xe4140c);
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,(char *)__i,iVar25,(char *)_Var20._M_node);
    testing::internal::AssertHelper::operator=(this_03,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xe4146f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe414e0);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
  ::insert<int_const*>
            ((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)this_01,(int *)this_00,(int *)0xe41501);
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::size((BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)0xe4151f);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(iVar25,uVar24),(char *)_Var20._M_node,&(_Var19._M_node)->_M_color,
             (unsigned_long *)this_01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_888);
  if (!bVar2) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xe4159a);
    testing::internal::AssertHelper::AssertHelper
              (this_02,type,(char *)__i,iVar25,(char *)_Var20._M_node);
    testing::internal::AssertHelper::operator=(this_03,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xe415fd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe41668);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0xe41675);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xe41682);
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, InsertRange) {
  // We just test the ints here, to make the placement-new easier.
  TypeParam ht_source;
  ht_source.insert(this->UniqueObject(10));
  ht_source.insert(this->UniqueObject(100));
  ht_source.insert(this->UniqueObject(1000));
  ht_source.insert(this->UniqueObject(10000));
  ht_source.insert(this->UniqueObject(100000));
  ht_source.insert(this->UniqueObject(1000000));

  const typename TypeParam::value_type input[] = {
      // This is a copy of the first element in ht_source.
      *ht_source.begin(), this->UniqueObject(2), this->UniqueObject(4),
      this->UniqueObject(8)};

  set<typename TypeParam::value_type> set_input;
  set_input.insert(this->UniqueObject(1111111));
  set_input.insert(this->UniqueObject(111111));
  set_input.insert(this->UniqueObject(11111));
  set_input.insert(this->UniqueObject(1111));
  set_input.insert(this->UniqueObject(111));
  set_input.insert(this->UniqueObject(11));

  // Insert from ht_source, an iterator of the same type as us.
  typename TypeParam::const_iterator begin = ht_source.begin();
  typename TypeParam::const_iterator end = begin;
  std::advance(end, 3);
  this->ht_.insert(begin, end);  // insert 3 elements from ht_source
  EXPECT_EQ(3u, this->ht_.size());
  EXPECT_TRUE(*this->ht_.begin() == this->UniqueObject(10) ||
              *this->ht_.begin() == this->UniqueObject(100) ||
              *this->ht_.begin() == this->UniqueObject(1000) ||
              *this->ht_.begin() == this->UniqueObject(10000) ||
              *this->ht_.begin() == this->UniqueObject(100000) ||
              *this->ht_.begin() == this->UniqueObject(1000000));

  // And insert from set_input, a separate, non-random-access iterator.
  typename set<typename TypeParam::value_type>::const_iterator set_begin;
  typename set<typename TypeParam::value_type>::const_iterator set_end;
  set_begin = set_input.begin();
  set_end = set_begin;
  std::advance(set_end, 3);
  this->ht_.insert(set_begin, set_end);
  EXPECT_EQ(6u, this->ht_.size());

  // Insert from input as well, a separate, random-access iterator.
  // The first element of input overlaps with an existing element
  // of ht_, so this should only up the size by 2.
  this->ht_.insert(&input[0], &input[3]);
  EXPECT_EQ(8u, this->ht_.size());
}